

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# listener.c
# Opt level: O0

int nni_listener_start(nni_listener *l,int flags)

{
  _Bool _Var1;
  uint32_t uVar2;
  char *pcVar3;
  char local_b8 [8];
  char us [144];
  nng_url *url;
  int rv;
  int flags_local;
  nni_listener *l_local;
  
  _Var1 = nni_atomic_flag_test_and_set(&l->l_started);
  if (_Var1) {
    l_local._4_4_ = NNG_ESTATE;
  }
  else {
    l_local._4_4_ = (*(l->l_ops).l_bind)(l->l_data,&l->l_url);
    if (l_local._4_4_ == NNG_OK) {
      us._136_8_ = nni_listener_url(l);
      nng_url_sprintf(local_b8,0x90,(nng_url *)us._136_8_);
      uVar2 = nni_sock_id(l->l_sock);
      nng_log_info("NNG-LISTEN","Starting listener for socket<%u> on %s",(ulong)uVar2,local_b8);
      listener_accept_start(l);
      l_local._4_4_ = NNG_OK;
    }
    else {
      uVar2 = nni_sock_id(l->l_sock);
      pcVar3 = nng_strerror(l_local._4_4_);
      nng_log_warn("NNG-BIND-FAIL","Failed binding socket<%u>: %s",(ulong)uVar2,pcVar3);
      nni_listener_bump_error(l,l_local._4_4_);
      nni_atomic_flag_reset(&l->l_started);
    }
  }
  return l_local._4_4_;
}

Assistant:

int
nni_listener_start(nni_listener *l, int flags)
{
	int            rv;
	const nng_url *url;
	char           us[NNG_MAXADDRSTRLEN];
	NNI_ARG_UNUSED(flags);

	if (nni_atomic_flag_test_and_set(&l->l_started)) {
		return (NNG_ESTATE);
	}

	if ((rv = l->l_ops.l_bind(l->l_data, &l->l_url)) != 0) {
		nng_log_warn("NNG-BIND-FAIL", "Failed binding socket<%u>: %s",
		    nni_sock_id(l->l_sock), nng_strerror(rv));
		nni_listener_bump_error(l, rv);
		nni_atomic_flag_reset(&l->l_started);
		return (rv);
	}
	// collect the URL which may have changed (e.g. binding to port 0)
	url = nni_listener_url(l);
	nng_url_sprintf(us, sizeof(us), url);
	nng_log_info("NNG-LISTEN", "Starting listener for socket<%u> on %s",
	    nni_sock_id(l->l_sock), us);

	listener_accept_start(l);

	return (0);
}